

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

void __thiscall
fakeit::UnexpectedMethodCallException::UnexpectedMethodCallException
          (UnexpectedMethodCallException *this,string *format)

{
  pointer pcVar1;
  
  *(undefined **)&(this->super_FakeitException).err = &__cxxabiv1::__pointer_type_info::vtable;
  (this->super_FakeitException)._vptr_FakeitException =
       (_func_int **)&PTR__UnexpectedMethodCallException_0012e0b0;
  (this->_format)._M_dataplus._M_p = (pointer)&(this->_format).field_2;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_format,pcVar1,pcVar1 + format->_M_string_length);
  return;
}

Assistant:

UnexpectedMethodCallException(std::string format) :
                _format(format) {
        }